

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AmpIO.cpp
# Opt level: O1

bool __thiscall
AmpIO::ReadWaveformTable(AmpIO *this,quadlet_t *buffer,unsigned_short offset,unsigned_short nquads)

{
  BasePort *pBVar1;
  char cVar2;
  uint32_t uVar3;
  uint uVar4;
  int iVar5;
  ulong uVar6;
  
  uVar3 = BoardIO::GetFirmwareVersion((BoardIO *)this);
  if ((uVar3 < 7) || (uVar3 = BoardIO::GetHardwareVersion((BoardIO *)this), uVar3 == 0x64524131)) {
    cVar2 = '\0';
  }
  else if (nquads == 0) {
    cVar2 = '\x01';
  }
  else {
    uVar4 = (*((this->super_FpgaIO).super_BoardIO.port)->_vptr_BasePort[0x19])();
    cVar2 = '\0';
    if ((offset < 0x400) && ((uint)nquads <= uVar4 >> 2)) {
      pBVar1 = (this->super_FpgaIO).super_BoardIO.port;
      iVar5 = (*pBVar1->_vptr_BasePort[0x26])
                        (pBVar1,(ulong)(this->super_FpgaIO).super_BoardIO.BoardId,
                         (ulong)(offset | 0x8000),buffer,(ulong)((uint)nquads * 4));
      cVar2 = (char)iVar5;
      if (cVar2 != '\0') {
        uVar6 = 0;
        do {
          uVar4 = buffer[uVar6] ^ 0xf000000;
          buffer[uVar6] =
               uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 |
               buffer[uVar6] << 0x18;
          uVar6 = uVar6 + 1;
        } while (nquads != uVar6);
      }
    }
  }
  return (bool)cVar2;
}

Assistant:

bool AmpIO::ReadWaveformTable(quadlet_t *buffer, unsigned short offset, unsigned short nquads)
{
    if (GetFirmwareVersion() < 7) return false;
    if (GetHardwareVersion() == dRA1_String) return false;

    if (nquads == 0) return true;
    if (nquads > (port->GetMaxReadDataSize()/sizeof(quadlet_t))) return false;
    if (offset > 1023) return false;
    nodeaddr_t address = 0x8000 + offset;   // ADDR_WAVEFORM = 0x8000
    bool ret = port->ReadBlock(BoardId, address, buffer, nquads*sizeof(quadlet_t));
    if (ret) {
        // Byteswap and invert digital output bits (see WriteDigitalOutput and GetDigitalOutput)
        for (unsigned short i = 0; i < nquads; i++)
            buffer[i] = bswap_32(buffer[i])^0x0000000f;
    }
    return ret;
}